

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalObject.cpp
# Opt level: O2

JsrtExternalObject *
JsrtExternalObject::Create
          (void *data,uint inlineSlotSize,JsFinalizeCallback finalizeCallback,
          RecyclableObject *prototype,ScriptContext *scriptContext,JsrtExternalType *type)

{
  bool bVar1;
  Recycler *pRVar2;
  undefined4 *puVar3;
  JsrtExternalObject *this;
  code *pcVar4;
  undefined1 local_60 [8];
  TrackAllocData data_1;
  
  data_1._32_8_ = data;
  if (prototype == (RecyclableObject *)0x0) {
    prototype = &Js::JavascriptLibraryBase::GetObjectPrototype
                           (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                             super_JavascriptLibraryBase)->super_RecyclableObject;
  }
  if (type == (JsrtExternalType *)0x0) {
    type = Js::JavascriptLibrary::GetCachedJsrtExternalType
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,0,
                      (uintptr_t)finalizeCallback,(uintptr_t)prototype);
    if (type == (JsrtExternalType *)0x0) {
      local_60 = (undefined1  [8])&JsrtExternalType::typeinfo;
      data_1.typeinfo = (type_info *)0x0;
      data_1.plusSize = 0xffffffffffffffff;
      data_1.count = (size_t)anon_var_dwarf_414e33;
      data_1.filename._0_4_ = 0x88;
      pRVar2 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
      type = (JsrtExternalType *)new<Memory::Recycler>(0x48,pRVar2,0x37a1d4);
      JsrtExternalType::JsrtExternalType(type,scriptContext,finalizeCallback,prototype);
      Js::JavascriptLibrary::CacheJsrtExternalType
                ((scriptContext->super_ScriptContextBase).javascriptLibrary,0,
                 (uintptr_t)finalizeCallback,(uintptr_t)prototype,type);
    }
  }
  if (((type->super_DynamicType).super_Type.flags & TypeFlagMask_JsrtExternal) == TypeFlagMask_None)
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar1 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
                       ,0x91,"(type->IsJsrtExternal())","type->IsJsrtExternal()");
    if (!bVar1) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar3 = 0;
  }
  data_1.typeinfo = (type_info *)(ulong)inlineSlotSize;
  if (finalizeCallback == (JsFinalizeCallback)0x0) {
    local_60 = (undefined1  [8])&typeinfo;
    data_1.plusSize = 0xffffffffffffffff;
    data_1.count = (size_t)anon_var_dwarf_414e33;
    data_1.filename._0_4_ = 0x9a;
    pRVar2 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
    pcVar4 = Memory::Recycler::Alloc;
  }
  else {
    local_60 = (undefined1  [8])&typeinfo;
    data_1.plusSize = 0xffffffffffffffff;
    data_1.count = (size_t)anon_var_dwarf_414e33;
    data_1.filename._0_4_ = 0x96;
    pRVar2 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
    pcVar4 = Memory::Recycler::AllocFinalized;
  }
  this = (JsrtExternalObject *)
         new<Memory::Recycler>(0x30,pRVar2,(offset_in_Recycler_to_subr)pcVar4,0);
  JsrtExternalObject(this,type,(void *)data_1._32_8_,inlineSlotSize);
  return this;
}

Assistant:

JsrtExternalObject* JsrtExternalObject::Create(void *data, uint inlineSlotSize, JsFinalizeCallback finalizeCallback, Js::RecyclableObject * prototype, Js::ScriptContext *scriptContext, JsrtExternalType * type)
{
    if (prototype == nullptr)
    {
        prototype = scriptContext->GetLibrary()->GetObjectPrototype();
    }
    if (type == nullptr)
    {
#ifdef _CHAKRACOREBUILD
        type = scriptContext->GetLibrary()->GetCachedJsrtExternalType(0, reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(prototype));
#else
        type = scriptContext->GetLibrary()->GetCachedJsrtExternalType(reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(prototype));
#endif

        if (type == nullptr)
        {
            type = RecyclerNew(scriptContext->GetRecycler(), JsrtExternalType, scriptContext, finalizeCallback, prototype);
#ifdef _CHAKRACOREBUILD
            scriptContext->GetLibrary()->CacheJsrtExternalType(0, reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(prototype), type);
#else
            scriptContext->GetLibrary()->CacheJsrtExternalType(reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(prototype), type);
#endif
        }
    }

    Assert(type->IsJsrtExternal());

    JsrtExternalObject * externalObject;
    if (finalizeCallback != nullptr)
    {
        externalObject = RecyclerNewFinalizedPlus(scriptContext->GetRecycler(), inlineSlotSize, JsrtExternalObject, static_cast<JsrtExternalType*>(type), data, inlineSlotSize);
    }
    else
    {
        externalObject = RecyclerNewPlus(scriptContext->GetRecycler(), inlineSlotSize, JsrtExternalObject, static_cast<JsrtExternalType*>(type), data, inlineSlotSize);
    }

    return externalObject;
}